

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

size_t Assimp::FBX::ParseTokenAsDim(Token *t)

{
  size_t sVar1;
  char *err;
  allocator<char> local_39;
  char *local_38;
  string local_30;
  
  sVar1 = ParseTokenAsDim(t,&local_38);
  if (local_38 == (char *)0x0) {
    return sVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,local_38,&local_39);
  anon_unknown.dwarf_dd088f::ParseError(&local_30,t);
}

Assistant:

size_t ParseTokenAsDim(const Token& t)
{
    const char* err;
    const size_t i = ParseTokenAsDim(t,err);
    if(err) {
        ParseError(err,t);
    }
    return i;
}